

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O0

char * __thiscall
ctemplate_htmlparser::HtmlparserCppTest::IdToName
          (HtmlparserCppTest *this,IdNameMap *list,int enum_id)

{
  IdNameMap *pIStack_18;
  int enum_id_local;
  IdNameMap *list_local;
  HtmlparserCppTest *this_local;
  
  pIStack_18 = list;
  if (list == (IdNameMap *)0x0) {
    fprintf(_stderr,"Check failed: %s\n","list != NULL");
    exit(1);
  }
  while( true ) {
    if (pIStack_18->name == (char *)0x0) {
      fprintf(_stderr,"Check failed: %s\n","false");
      exit(1);
    }
    if (enum_id == pIStack_18->id) break;
    pIStack_18 = pIStack_18 + 1;
  }
  return pIStack_18->name;
}

Assistant:

const char *HtmlparserCppTest::IdToName(const struct IdNameMap *list,
                                        int enum_id) {
  CHECK(list != NULL);
  while (list->name) {
    if (enum_id == list->id) {
      return list->name;
    }
    list++;
  }
  LOG(FATAL) << "Unknown id";
}